

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

pair<cmFileSet_*,_bool> __thiscall
cmTarget::GetOrCreateFileSet(cmTarget *this,string *name,string *type,cmFileSetVisibility vis)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_bool>
  pVar3;
  pair<cmFileSet_*,_bool> pVar4;
  cmListFileBacktrace bt;
  cmListFileBacktrace local_1b8;
  cmListFileBacktrace local_1a8;
  cmListFileBacktrace local_198;
  string local_188;
  string local_168;
  undefined1 local_148 [280];
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_168,(string *)name);
  std::__cxx11::string::string((string *)&local_188,(string *)type);
  cmFileSet::cmFileSet((cmFileSet *)(local_148 + 0xa0),&local_168,&local_188,vis);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>::
  pair<cmFileSet,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>
              *)local_148,name,(cmFileSet *)(local_148 + 0xa0));
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFileSet>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFileSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFileSet>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmFileSet>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFileSet>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFileSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFileSet>>>
                      *)&(_Var1._M_head_impl)->FileSets,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>
                      *)local_148);
  pVar4._8_4_ = pVar3._8_4_;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>
         *)local_148);
  cmFileSet::~cmFileSet((cmFileSet *)(local_148 + 0xa0));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_00292d71;
  cmMakefile::GetBacktrace((cmMakefile *)local_148);
  __x._M_str = (type->_M_dataplus)._M_p;
  __x._M_len = type->_M_string_length;
  bVar2 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                HeadersFileSets);
  if (bVar2) {
    this_00 = &local_198.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    local_198.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_148._0_8_;
    local_198.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
    local_148._0_8_ = (element_type *)0x0;
    local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    anon_unknown.dwarf_9d72de::FileSetType::AddFileSet
              (&((this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->HeadersFileSets,
               name,vis,&local_198);
LAB_00292d5f:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  }
  else {
    __x_00._M_str = (type->_M_dataplus)._M_p;
    __x_00._M_len = type->_M_string_length;
    bVar2 = std::operator==(__x_00,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    &((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->CxxModulesFileSets);
    if (bVar2) {
      this_00 = &local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
      local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_148._0_8_;
      local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
      local_148._0_8_ = (element_type *)0x0;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      anon_unknown.dwarf_9d72de::FileSetType::AddFileSet
                (&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  CxxModulesFileSets,name,vis,&local_1a8);
      goto LAB_00292d5f;
    }
    __x_01._M_str = (type->_M_dataplus)._M_p;
    __x_01._M_len = type->_M_string_length;
    bVar2 = std::operator==(__x_01,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    &((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->CxxModuleHeadersFileSets);
    if (bVar2) {
      this_00 = &local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
      local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_148._0_8_;
      local_1b8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
      local_148._0_8_ = (element_type *)0x0;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      anon_unknown.dwarf_9d72de::FileSetType::AddFileSet
                (&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  CxxModuleHeadersFileSets,name,vis,&local_1b8);
      goto LAB_00292d5f;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
LAB_00292d71:
  pVar4.first = (cmFileSet *)(pVar3.first._M_node._M_node + 2);
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<cmFileSet*, bool> cmTarget::GetOrCreateFileSet(
  const std::string& name, const std::string& type, cmFileSetVisibility vis)
{
  auto result = this->impl->FileSets.emplace(
    std::make_pair(name, cmFileSet(name, type, vis)));
  if (result.second) {
    auto bt = this->impl->Makefile->GetBacktrace();
    if (type == this->impl->HeadersFileSets.TypeName) {
      this->impl->HeadersFileSets.AddFileSet(name, vis, std::move(bt));
    } else if (type == this->impl->CxxModulesFileSets.TypeName) {
      this->impl->CxxModulesFileSets.AddFileSet(name, vis, std::move(bt));
    } else if (type == this->impl->CxxModuleHeadersFileSets.TypeName) {
      this->impl->CxxModuleHeadersFileSets.AddFileSet(name, vis,
                                                      std::move(bt));
    }
  }
  return std::make_pair(&result.first->second, result.second);
}